

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestSessionExecutor.cpp
# Opt level: O0

qpTestCaseType tcu::nodeTypeToTestCaseType(TestNodeType nodeType)

{
  qpTestCaseType local_c;
  TestNodeType nodeType_local;
  
  switch(nodeType) {
  case NODETYPE_SELF_VALIDATE:
    local_c = QP_TEST_CASE_TYPE_SELF_VALIDATE;
    break;
  case NODETYPE_PERFORMANCE:
    local_c = QP_TEST_CASE_TYPE_PERFORMANCE;
    break;
  case NODETYPE_CAPABILITY:
    local_c = QP_TEST_CASE_TYPE_CAPABILITY;
    break;
  case NODETYPE_ACCURACY:
    local_c = QP_TEST_CASE_TYPE_ACCURACY;
    break;
  default:
    local_c = QP_TEST_CASE_TYPE_LAST;
  }
  return local_c;
}

Assistant:

static qpTestCaseType nodeTypeToTestCaseType (TestNodeType nodeType)
{
	switch (nodeType)
	{
		case NODETYPE_SELF_VALIDATE:	return QP_TEST_CASE_TYPE_SELF_VALIDATE;
		case NODETYPE_PERFORMANCE:		return QP_TEST_CASE_TYPE_PERFORMANCE;
		case NODETYPE_CAPABILITY:		return QP_TEST_CASE_TYPE_CAPABILITY;
		case NODETYPE_ACCURACY:			return QP_TEST_CASE_TYPE_ACCURACY;
		default:
			DE_ASSERT(false);
			return QP_TEST_CASE_TYPE_LAST;
	}
}